

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line_interface.cc
# Opt level: O0

bool __thiscall
google::protobuf::compiler::CommandLineInterface::EncodeOrDecode
          (CommandLineInterface *this,DescriptorPool *pool)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  Descriptor *type_00;
  ostream *poVar4;
  Message *pMVar5;
  undefined4 extraout_var;
  MessageLite *pMVar6;
  ErrorPrinter *local_1a0;
  string local_178 [36];
  uint local_154;
  undefined1 local_150 [8];
  Parser parser;
  ErrorPrinter error_collector;
  FileOutputStream out;
  FileInputStream in;
  scoped_ptr<google::protobuf::Message> local_58;
  scoped_ptr<google::protobuf::Message> message;
  DynamicMessageFactory dynamic_factory;
  Descriptor *type;
  DescriptorPool *pool_local;
  CommandLineInterface *this_local;
  
  type_00 = DescriptorPool::FindMessageTypeByName(pool,&this->codec_type_);
  if (type_00 == (Descriptor *)0x0) {
    poVar4 = std::operator<<((ostream *)&std::cerr,"Type not defined: ");
    poVar4 = std::operator<<(poVar4,(string *)&this->codec_type_);
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    this_local._7_1_ = 0;
    goto LAB_00233004;
  }
  DynamicMessageFactory::DynamicMessageFactory((DynamicMessageFactory *)&message,pool);
  pMVar5 = DynamicMessageFactory::GetPrototype((DynamicMessageFactory *)&message,type_00);
  iVar2 = (*(pMVar5->super_MessageLite)._vptr_MessageLite[3])();
  internal::scoped_ptr<google::protobuf::Message>::scoped_ptr
            (&local_58,(Message *)CONCAT44(extraout_var,iVar2));
  if (this->mode_ == MODE_ENCODE) {
    anon_unknown_0::SetFdToTextMode(0);
    anon_unknown_0::SetFdToBinaryMode(1);
  }
  else {
    anon_unknown_0::SetFdToBinaryMode(0);
    anon_unknown_0::SetFdToTextMode(1);
  }
  io::FileInputStream::FileInputStream((FileInputStream *)&out.impl_.buffer_size_,0,-1);
  io::FileOutputStream::FileOutputStream((FileOutputStream *)&error_collector.tree_,1,-1);
  if (this->mode_ == MODE_ENCODE) {
    ErrorPrinter::ErrorPrinter
              ((ErrorPrinter *)&parser.allow_partial_,this->error_format_,(DiskSourceTree *)0x0);
    TextFormat::Parser::Parser((Parser *)local_150);
    local_1a0 = (ErrorPrinter *)0x0;
    if (&stack0x00000000 != (undefined1 *)0x130) {
      local_1a0 = &error_collector;
    }
    TextFormat::Parser::RecordErrorsTo((Parser *)local_150,(ErrorCollector *)local_1a0);
    TextFormat::Parser::AllowPartialMessage((Parser *)local_150,true);
    pMVar5 = internal::scoped_ptr<google::protobuf::Message>::get(&local_58);
    bVar1 = TextFormat::Parser::Parse
                      ((Parser *)local_150,(ZeroCopyInputStream *)&out.impl_.buffer_size_,pMVar5);
    if (!bVar1) {
      poVar4 = std::operator<<((ostream *)&std::cerr,"Failed to parse input.");
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      this_local._7_1_ = 0;
    }
    local_154 = (uint)!bVar1;
    TextFormat::Parser::~Parser((Parser *)local_150);
    ErrorPrinter::~ErrorPrinter((ErrorPrinter *)&parser.allow_partial_);
    if (local_154 == 0) {
LAB_00232db6:
      pMVar5 = internal::scoped_ptr<google::protobuf::Message>::operator->(&local_58);
      uVar3 = (*(pMVar5->super_MessageLite)._vptr_MessageLite[5])();
      if ((uVar3 & 1) == 0) {
        poVar4 = std::operator<<((ostream *)&std::cerr,
                                 "warning:  Input message is missing required fields:  ");
        pMVar5 = internal::scoped_ptr<google::protobuf::Message>::operator->(&local_58);
        (*(pMVar5->super_MessageLite)._vptr_MessageLite[6])(local_178);
        poVar4 = std::operator<<(poVar4,local_178);
        std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
        std::__cxx11::string::~string(local_178);
      }
      if (this->mode_ == MODE_ENCODE) {
        pMVar6 = &internal::scoped_ptr<google::protobuf::Message>::operator->(&local_58)->
                  super_MessageLite;
        bVar1 = MessageLite::SerializePartialToZeroCopyStream
                          (pMVar6,(ZeroCopyOutputStream *)&error_collector.tree_);
        if (bVar1) {
LAB_00232f9e:
          this_local._7_1_ = 1;
          local_154 = 1;
        }
        else {
          poVar4 = std::operator<<((ostream *)&std::cerr,"output: I/O error.");
          std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
          this_local._7_1_ = 0;
          local_154 = 1;
        }
      }
      else {
        pMVar5 = internal::scoped_ptr<google::protobuf::Message>::operator*(&local_58);
        bVar1 = TextFormat::Print(pMVar5,(ZeroCopyOutputStream *)&error_collector.tree_);
        if (bVar1) goto LAB_00232f9e;
        poVar4 = std::operator<<((ostream *)&std::cerr,"output: I/O error.");
        std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
        this_local._7_1_ = 0;
        local_154 = 1;
      }
    }
  }
  else {
    pMVar6 = &internal::scoped_ptr<google::protobuf::Message>::operator->(&local_58)->
              super_MessageLite;
    bVar1 = MessageLite::ParsePartialFromZeroCopyStream
                      (pMVar6,(ZeroCopyInputStream *)&out.impl_.buffer_size_);
    if (bVar1) goto LAB_00232db6;
    poVar4 = std::operator<<((ostream *)&std::cerr,"Failed to parse input.");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    this_local._7_1_ = 0;
    local_154 = 1;
  }
  io::FileOutputStream::~FileOutputStream((FileOutputStream *)&error_collector.tree_);
  io::FileInputStream::~FileInputStream((FileInputStream *)&out.impl_.buffer_size_);
  internal::scoped_ptr<google::protobuf::Message>::~scoped_ptr(&local_58);
  DynamicMessageFactory::~DynamicMessageFactory((DynamicMessageFactory *)&message);
LAB_00233004:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool CommandLineInterface::EncodeOrDecode(const DescriptorPool* pool) {
  // Look up the type.
  const Descriptor* type = pool->FindMessageTypeByName(codec_type_);
  if (type == NULL) {
    cerr << "Type not defined: " << codec_type_ << endl;
    return false;
  }

  DynamicMessageFactory dynamic_factory(pool);
  scoped_ptr<Message> message(dynamic_factory.GetPrototype(type)->New());

  if (mode_ == MODE_ENCODE) {
    SetFdToTextMode(STDIN_FILENO);
    SetFdToBinaryMode(STDOUT_FILENO);
  } else {
    SetFdToBinaryMode(STDIN_FILENO);
    SetFdToTextMode(STDOUT_FILENO);
  }

  io::FileInputStream in(STDIN_FILENO);
  io::FileOutputStream out(STDOUT_FILENO);

  if (mode_ == MODE_ENCODE) {
    // Input is text.
    ErrorPrinter error_collector(error_format_);
    TextFormat::Parser parser;
    parser.RecordErrorsTo(&error_collector);
    parser.AllowPartialMessage(true);

    if (!parser.Parse(&in, message.get())) {
      cerr << "Failed to parse input." << endl;
      return false;
    }
  } else {
    // Input is binary.
    if (!message->ParsePartialFromZeroCopyStream(&in)) {
      cerr << "Failed to parse input." << endl;
      return false;
    }
  }

  if (!message->IsInitialized()) {
    cerr << "warning:  Input message is missing required fields:  "
         << message->InitializationErrorString() << endl;
  }

  if (mode_ == MODE_ENCODE) {
    // Output is binary.
    if (!message->SerializePartialToZeroCopyStream(&out)) {
      cerr << "output: I/O error." << endl;
      return false;
    }
  } else {
    // Output is text.
    if (!TextFormat::Print(*message, &out)) {
      cerr << "output: I/O error." << endl;
      return false;
    }
  }

  return true;
}